

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O3

bool google::protobuf::compiler::cpp::IsStringOrMessage(FieldDescriptor *field)

{
  byte bVar1;
  LogMessage *other;
  FieldDescriptor *local_48;
  code *local_40 [7];
  
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_40[0] = FieldDescriptor::TypeOnceInit;
    local_48 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),local_40,&local_48);
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) - 1U < 10) {
    bVar1 = (byte)(0x300 >> ((byte)(*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                                            (ulong)*(uint *)(field + 0x38) * 4) - 1U) & 0x1f));
  }
  else {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_40,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/cpp/cpp_helpers.cc"
               ,0x3af);
    other = internal::LogMessage::operator<<((LogMessage *)local_40,"Can\'t get here.");
    internal::LogFinisher::operator=((LogFinisher *)&local_48,other);
    internal::LogMessage::~LogMessage((LogMessage *)local_40);
    bVar1 = 0;
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool IsStringOrMessage(const FieldDescriptor* field) {
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
    case FieldDescriptor::CPPTYPE_INT64:
    case FieldDescriptor::CPPTYPE_UINT32:
    case FieldDescriptor::CPPTYPE_UINT64:
    case FieldDescriptor::CPPTYPE_DOUBLE:
    case FieldDescriptor::CPPTYPE_FLOAT:
    case FieldDescriptor::CPPTYPE_BOOL:
    case FieldDescriptor::CPPTYPE_ENUM:
      return false;
    case FieldDescriptor::CPPTYPE_STRING:
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return true;
  }

  GOOGLE_LOG(FATAL) << "Can't get here.";
  return false;
}